

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

MemberExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::MemberExpr,(anonymous_namespace)::Node*&,char_const(&)[3],(anonymous_namespace)::Node*&>
          (Db *this,Node **args,char (*args_1) [3],Node **args_2)

{
  Node *pNVar1;
  Node *pNVar2;
  MemberExpr *pMVar3;
  size_t sVar4;
  
  pMVar3 = (MemberExpr *)
           anon_unknown.dwarf_25095d::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x30);
  pNVar1 = *args;
  sVar4 = strlen(*args_1);
  pNVar2 = *args_2;
  (pMVar3->super_Expr).super_Node.K = KExpr;
  (pMVar3->super_Expr).super_Node.RHSComponentCache = No;
  (pMVar3->super_Expr).super_Node.ArrayCache = No;
  (pMVar3->super_Expr).super_Node.FunctionCache = No;
  (pMVar3->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c5ed8;
  pMVar3->LHS = pNVar1;
  (pMVar3->Kind).First = *args_1;
  (pMVar3->Kind).Last = *args_1 + sVar4;
  pMVar3->RHS = pNVar2;
  return pMVar3;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }